

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_misc.c
# Opt level: O0

err_t bignPubkeyVal(bign_params *params,octet *pubkey)

{
  size_t sVar1;
  size_t sVar2;
  bool_t bVar3;
  ec_o *ec_00;
  octet *in_RSI;
  void *in_RDI;
  size_t unaff_retaddr;
  void *stack;
  word *Q;
  ec_o *ec;
  void *state;
  size_t n;
  size_t no;
  err_t code;
  size_t in_stack_ffffffffffffffa8;
  bign_params *in_stack_ffffffffffffffb0;
  word *pwVar4;
  word *stack_00;
  ec_o *a;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  err_t eVar5;
  
  bVar3 = memIsValid(in_RDI,0x150);
  if (bVar3 == 0) {
    eVar5 = 0x6d;
  }
  else {
    bVar3 = bignIsOperable(in_stack_ffffffffffffffb0);
    if (bVar3 == 0) {
      eVar5 = 0x1f6;
    }
    else {
      bignStart_keep(unaff_retaddr,
                     (bign_deep_i)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      ec_00 = (ec_o *)blobCreate(in_stack_ffffffffffffffa8);
      if (ec_00 == (ec_o *)0x0) {
        eVar5 = 0x6e;
      }
      else {
        eVar5 = bignStart(in_RSI,(bign_params *)
                                 CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
        if (eVar5 == 0) {
          sVar1 = ec_00->f->no;
          sVar2 = ec_00->f->n;
          a = ec_00;
          bVar3 = memIsValid(in_RSI,sVar1 << 1);
          if (bVar3 == 0) {
            blobClose((blob_t)0x1450b1);
            eVar5 = 0x6d;
          }
          else {
            stack_00 = (word *)((long)&(ec_00->hdr).keep + (ec_00->hdr).keep);
            pwVar4 = stack_00 + sVar2 * 2;
            bVar3 = (*ec_00->f->from)(stack_00,in_RSI,ec_00->f,pwVar4);
            if ((bVar3 != 0) &&
               (bVar3 = (*ec_00->f->from)(stack_00 + sVar2,in_RSI + sVar1,ec_00->f,pwVar4),
               bVar3 != 0)) {
              bVar3 = ecpIsOnA((word *)a,ec_00,stack_00);
              eVar5 = 0x1f9;
              if (bVar3 != 0) {
                eVar5 = 0;
              }
              blobClose((blob_t)0x145197);
              return eVar5;
            }
            blobClose((blob_t)0x14515c);
            eVar5 = 0x1f9;
          }
        }
        else {
          blobClose((blob_t)0x145055);
        }
      }
    }
  }
  return eVar5;
}

Assistant:

err_t bignPubkeyVal(const bign_params* params, const octet pubkey[])
{
	err_t code;
	size_t no, n;
	// состояние
	void* state;
	ec_o* ec;			/* описание эллиптической кривой */
	word* Q;			/* [2n] открытый ключ */
	void* stack;
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (!bignIsOperable(params))
		return ERR_BAD_PARAMS;
	// создать состояние
	state = blobCreate(bignStart_keep(params->l, bignPubkeyVal_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bignStart(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	no  = ec->f->no;
	n = ec->f->n;
	// проверить входные указатели
	if (!memIsValid(pubkey, 2 * no))
	{
		blobClose(state);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	Q = objEnd(ec, word);
	stack = Q + 2 * n;
	// загрузить pt
	if (!qrFrom(ecX(Q), pubkey, ec->f, stack) ||
		!qrFrom(ecY(Q, n), pubkey + no, ec->f, stack))
	{
		blobClose(state);
		return ERR_BAD_PUBKEY;
	}
	// Q \in ec?
	code = ecpIsOnA(Q, ec, stack) ? ERR_OK : ERR_BAD_PUBKEY;
	// завершение
	blobClose(state);
	return code;
}